

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-curse.c
# Opt level: O2

_Bool curses_are_equal(object *obj1,object *obj2)

{
  curse_data *pcVar1;
  curse_data *pcVar2;
  curse_data *pcVar3;
  curse_data *pcVar4;
  ulong uVar5;
  _Bool _Var6;
  
  pcVar3 = obj1->curses;
  pcVar4 = obj2->curses;
  _Var6 = pcVar3 == (curse_data *)0x0 && pcVar4 == (curse_data *)0x0;
  if (pcVar4 != (curse_data *)0x0 && pcVar3 != (curse_data *)0x0) {
    uVar5 = 0;
    do {
      _Var6 = z_info->curse_max == uVar5;
      if (_Var6) {
        return _Var6;
      }
      pcVar1 = pcVar3 + uVar5;
      pcVar2 = pcVar4 + uVar5;
      uVar5 = uVar5 + 1;
    } while (pcVar1->power == pcVar2->power);
  }
  return _Var6;
}

Assistant:

bool curses_are_equal(const struct object *obj1, const struct object *obj2)
{
	int i;

	if (!obj1->curses && !obj2->curses) return true;
	if (obj1->curses && !obj2->curses) return false;
	if (!obj1->curses && obj2->curses) return false;

	for (i = 0; i < z_info->curse_max; i++) {
		if (obj1->curses[i].power != obj2->curses[i].power) return false;
	}

	return true;
}